

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rate_adaptive_code.cpp
# Opt level: O1

void __thiscall
rate_adaptive_code_from_decoder_obtain_from_advanced_encoder_equals_Test::TestBody
          (rate_adaptive_code_from_decoder_obtain_from_advanced_encoder_equals_Test *this)

{
  pointer *__ptr_2;
  pointer *__ptr;
  char *in_R9;
  AssertionResult gtest_ar_;
  vector<unsigned_short,_std::allocator<unsigned_short>_> rows_to_combine;
  RateAdaptiveCode<unsigned_short> H1;
  RateAdaptiveCode<unsigned_short> H2;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  AssertHelper local_180;
  internal local_178 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_170;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_168;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_150;
  string local_138;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  local_118;
  RateAdaptiveCode<unsigned_short> local_100;
  RateAdaptiveCode<unsigned_short> local_88;
  
  std::vector<unsigned_short,std::allocator<unsigned_short>>::vector<unsigned_short_const*,void>
            ((vector<unsigned_short,std::allocator<unsigned_short>> *)&local_150,
             &AutogenRateAdapt::rows,
             (unsigned_short *)
             "N7testing8internal15TestFactoryImplI45encoder_rate_adapted_Hx_benchmark_unsafe_TestEE"
             ,(allocator_type *)&local_100);
  LDPC4QKD::
  FixedSizeEncoderQC<unsigned_char,_64UL,_192UL,_32UL,_800UL,_unsigned_short,_unsigned_char,_unsigned_char>
  ::get_pos_varn(&local_118,
                 (FixedSizeEncoderQC<unsigned_char,_64UL,_192UL,_32UL,_800UL,_unsigned_short,_unsigned_char,_unsigned_char>
                  *)LDPC4QKD::encoder_2048x6144_4663d91);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&local_168,&local_150);
  LDPC4QKD::RateAdaptiveCode<unsigned_short>::RateAdaptiveCode(&local_100,&local_118,&local_168,0);
  if (local_168.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_168.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::~vector(&local_118);
  anon_unknown.dwarf_5d66a::get_code_big_wra();
  local_178[0] = (internal)
                 LDPC4QKD::RateAdaptiveCode<unsigned_short>::operator==(&local_100,&local_88);
  local_170 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_178[0]) {
    testing::Message::Message((Message *)&local_188);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_138,local_178,(AssertionResult *)"H1 == H2","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/XQP-Munich[P]LDPC4QKD/tests/test_rate_adaptive_code.cpp"
               ,0x161,local_138._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if (local_188._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_188._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (local_170 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_170,local_170);
  }
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::~vector(&local_88.pos_varn);
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::~vector(&local_88.pos_checkn);
  if (local_88.rows_to_combine.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.rows_to_combine.
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.rows_to_combine.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.rows_to_combine.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::~vector(&local_88.mother_pos_varn);
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::~vector(&local_100.pos_varn);
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::~vector(&local_100.pos_checkn);
  if (local_100.rows_to_combine.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.rows_to_combine.
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_100.rows_to_combine.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.rows_to_combine.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::~vector(&local_100.mother_pos_varn);
  if (local_150.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_150.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_150.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_150.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(rate_adaptive_code_from_decoder, obtain_from_advanced_encoder_equals) {
    std::vector<std::uint16_t> rows_to_combine(AutogenRateAdapt::rows.begin(), AutogenRateAdapt::rows.end());
    RateAdaptiveCode<std::uint16_t> H1(encoder_2048x6144_4663d91.get_pos_varn(), rows_to_combine);

    // TODO add random rate adaption for comparison
    auto H2 = get_code_big_wra();
    EXPECT_TRUE(H1 == H2);
}